

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O2

Node * __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::FindLessThan
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this,char **key)

{
  int iVar1;
  Node *pNVar2;
  Node *pNVar3;
  int n;
  Node *this_00;
  
  pNVar2 = this->head_;
  n = (this->max_height_).super___atomic_base<int>._M_i + -1;
  this_00 = pNVar2;
  while ((this_00 == pNVar2 ||
         (iVar1 = MemTable::KeyComparator::operator()(&this->compare_,this_00->key,*key), iVar1 < 0)
         )) {
    pNVar3 = Node::Next(this_00,n);
    if ((pNVar3 == (Node *)0x0) ||
       (iVar1 = MemTable::KeyComparator::operator()(&this->compare_,pNVar3->key,*key), -1 < iVar1))
    {
      if (n == 0) {
        return this_00;
      }
      n = n + -1;
      pNVar3 = this_00;
    }
    pNVar2 = this->head_;
    this_00 = pNVar3;
  }
  __assert_fail("x == head_ || compare_(x->key, key) < 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/./db/skiplist.h"
                ,0x121,
                "typename SkipList<Key, Comparator>::Node *leveldb::SkipList<const char *, leveldb::MemTable::KeyComparator>::FindLessThan(const Key &) const [Key = const char *, Comparator = leveldb::MemTable::KeyComparator]"
               );
}

Assistant:

typename SkipList<Key, Comparator>::Node*
SkipList<Key, Comparator>::FindLessThan(const Key& key) const {
  Node* x = head_;
  int level = GetMaxHeight() - 1;
  while (true) {
    assert(x == head_ || compare_(x->key, key) < 0);
    Node* next = x->Next(level);
    if (next == nullptr || compare_(next->key, key) >= 0) {
      if (level == 0) {
        return x;
      } else {
        // Switch to next list
        level--;
      }
    } else {
      x = next;
    }
  }
}